

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O1

bool double_conversion::Advance<char_const*>(char **it,uc16 separator,int base,char **end)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  undefined6 in_register_00000032;
  char *pcVar5;
  
  pcVar5 = *it;
  iVar4 = (int)CONCAT62(in_register_00000032,separator);
  if (iVar4 == 0) {
    *it = pcVar5 + 1;
    bVar3 = pcVar5 + 1 == *end;
  }
  else {
    bVar3 = isDigit((int)*pcVar5,base);
    pcVar1 = pcVar5 + 1;
    *it = pcVar1;
    pcVar2 = *end;
    if ((~bVar3 & 1U) != 0 || pcVar1 == pcVar2) {
      bVar3 = bVar3 || pcVar1 == pcVar2;
    }
    else {
      pcVar5 = pcVar5 + 2;
      if (pcVar5 == pcVar2) {
        bVar3 = false;
      }
      else {
        if ((*pcVar1 == iVar4) && (bVar3 = isDigit((int)*pcVar5,base), bVar3)) {
          *it = pcVar5;
        }
        bVar3 = *it == *end;
      }
    }
  }
  return bVar3;
}

Assistant:

static bool Advance (Iterator* it, uc16 separator, int base, Iterator& end) {
  if (separator == StringToDoubleConverter::kNoSeparator) {
    ++(*it);
    return *it == end;
  }
  if (!isDigit(**it, base)) {
    ++(*it);
    return *it == end;
  }
  ++(*it);
  if (*it == end) return true;
  if (*it + 1 == end) return false;
  if (**it == separator && isDigit(*(*it + 1), base)) {
    ++(*it);
  }
  return *it == end;
}